

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

size_t __thiscall sentencepiece::TrainerSpec::ByteSizeLong(TrainerSpec *this)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Type *pTVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  uint in_ESI;
  int n;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  sVar5 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar4 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = sVar5 + uVar4;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      in_ESI = uVar9;
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->input_).super_RepeatedPtrFieldBase,uVar9);
      uVar3 = (uint)pTVar6->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar10 = lVar10 + pTVar6->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  uVar4 = (this->accept_language_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = lVar10 + (ulong)uVar4;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      in_ESI = uVar9;
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->accept_language_).super_RepeatedPtrFieldBase,uVar9);
      uVar3 = (uint)pTVar6->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar10 = lVar10 + pTVar6->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  uVar4 = (this->control_symbols_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = lVar10 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      in_ESI = uVar9;
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->control_symbols_).super_RepeatedPtrFieldBase,uVar9);
      uVar3 = (uint)pTVar6->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar10 = lVar10 + pTVar6->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  uVar4 = (this->user_defined_symbols_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = lVar10 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      in_ESI = uVar9;
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->user_defined_symbols_).super_RepeatedPtrFieldBase,uVar9);
      uVar3 = (uint)pTVar6->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + pTVar6->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      lVar10 = *(long *)(((ulong)(this->model_prefix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      lVar10 = *(long *)(((ulong)(this->input_format_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 4) != 0) {
      lVar10 = *(long *)(((ulong)(this->required_chars_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8)
      ;
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 8) != 0) {
      lVar10 = *(long *)(((ulong)(this->unk_surface_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x10) != 0) {
      lVar10 = *(long *)(((ulong)(this->unk_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x20) != 0) {
      lVar10 = *(long *)(((ulong)(this->bos_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x40) != 0) {
      lVar10 = *(long *)(((ulong)(this->eos_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar4 < '\0') {
      lVar10 = *(long *)(((ulong)(this->pad_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      lVar10 = *(long *)(((ulong)(this->pretokenization_delimiter_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 9 & 1) != 0) {
      lVar10 = *(long *)(((ulong)(this->seed_sentencepieces_file_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe) + 8);
      uVar9 = (uint)lVar10 | 1;
      iVar2 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 10 & 1) != 0) {
      if (this->self_test_sample_size_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar9 = this->self_test_sample_size_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      if (this->mining_sentence_size_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar9 = this->mining_sentence_size_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      uVar7 = this->input_sentence_size_ | 1;
      lVar10 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar10 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      if (this->training_sentence_size_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar9 = this->training_sentence_size_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    sVar8 = sVar5 + 3;
    if ((uVar4 >> 0xe & 1) == 0) {
      sVar8 = sVar5;
    }
    sVar5 = sVar8 + 3;
    if (-1 < (short)uVar4) {
      sVar5 = sVar8;
    }
  }
  if ((uVar4 & 0xff0000) != 0) {
    sVar8 = sVar5 + 3;
    if ((uVar4 >> 0x10 & 1) == 0) {
      sVar8 = sVar5;
    }
    sVar5 = sVar8 + 3;
    if ((uVar4 >> 0x11 & 1) == 0) {
      sVar5 = sVar8;
    }
    auVar11._0_4_ = -(uint)((uVar4 & 0x200000) == 0);
    auVar11._4_4_ = -(uint)((uVar4 & 0x100000) == 0);
    auVar11._8_4_ = -(uint)((uVar4 & 0x80000) == 0);
    auVar11._12_4_ = -(uint)((uVar4 & 0x40000) == 0);
    in_ESI = movmskps(in_ESI,auVar11);
    sVar8 = sVar5 + 3;
    if ((in_ESI & 8) != 0) {
      sVar8 = sVar5;
    }
    sVar5 = sVar8 + 3;
    if ((in_ESI & 4) != 0) {
      sVar5 = sVar8;
    }
    sVar8 = sVar5 + 3;
    if ((in_ESI & 2) != 0) {
      sVar8 = sVar5;
    }
    if ((in_ESI & 1) == 0) {
      if (this->unk_id_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar9 = this->unk_id_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar8 = sVar8 + uVar7;
    }
    sVar5 = sVar8 + 6;
    if ((uVar4 >> 0x16 & 1) == 0) {
      sVar5 = sVar8;
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      uVar7 = this->differential_privacy_clipping_threshold_ | 1;
      lVar10 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar10 * 9 + 0x49U >> 6) + 2;
    }
  }
  if (0xffffff < uVar4) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      if (this->model_type_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar9 = this->model_type_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar4 >> 0x19 & 1) != 0) {
      if (this->vocab_size_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar9 = this->vocab_size_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    sVar8 = sVar5 + 5;
    if ((uVar4 >> 0x1a & 1) == 0) {
      sVar8 = sVar5;
    }
    if ((uVar4 >> 0x1b & 1) != 0) {
      if (this->seed_sentencepiece_size_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar9 = this->seed_sentencepiece_size_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar7;
    }
    sVar5 = sVar8 + 5;
    if ((uVar4 >> 0x1c & 1) == 0) {
      sVar5 = sVar8;
    }
    if ((uVar4 >> 0x1d & 1) != 0) {
      if (this->num_threads_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar9 = this->num_threads_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar4 >> 0x1e & 1) != 0) {
      if (this->num_sub_iterations_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar9 = this->num_sub_iterations_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((int)uVar4 < 0) {
      if (this->max_sentence_length_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar4 = this->max_sentence_length_ | 1;
        iVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
  }
  uVar4 = (this->_has_bits_).has_bits_[1];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      if (this->max_sentencepiece_length_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar9 = this->max_sentencepiece_length_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
    sVar8 = sVar5 + 3;
    if ((uVar4 & 2) == 0) {
      sVar8 = sVar5;
    }
    sVar5 = sVar8 + 3;
    if ((uVar4 & 4) == 0) {
      sVar5 = sVar8;
    }
    sVar8 = sVar5 + 3;
    if ((uVar4 & 8) == 0) {
      sVar8 = sVar5;
    }
    auVar12._0_4_ = -(uint)((uVar4 & 0x80) == 0);
    auVar12._4_4_ = -(uint)((uVar4 & 0x40) == 0);
    auVar12._8_4_ = -(uint)((uVar4 & 0x20) == 0);
    auVar12._12_4_ = -(uint)((uVar4 & 0x10) == 0);
    uVar9 = movmskps(in_ESI,auVar12);
    sVar5 = sVar8 + 3;
    if ((uVar9 & 8) != 0) {
      sVar5 = sVar8;
    }
    sVar8 = sVar5 + 3;
    if ((uVar9 & 4) != 0) {
      sVar8 = sVar5;
    }
    sVar5 = sVar8 + 3;
    if ((uVar9 & 2) != 0) {
      sVar5 = sVar8;
    }
    if ((uVar9 & 1) == 0) {
      if (this->bos_id_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar9 = this->bos_id_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
  }
  if ((uVar4 & 0x300) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      if (this->eos_id_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar9 = this->eos_id_ | 1;
        iVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar4 >> 9 & 1) != 0) {
      if (this->pad_id_ < 0) {
        uVar7 = 0xc;
      }
      else {
        uVar4 = this->pad_id_ | 1;
        iVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
      }
      sVar5 = sVar5 + uVar7;
    }
  }
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    sVar5 = sVar5 + *(long *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict1)sVar5;
  return sVar5;
}

Assistant:

size_t TrainerSpec::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.TrainerSpec)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string input = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(input_.size());
  for (int i = 0, n = input_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      input_.Get(i));
  }

  // repeated string accept_language = 5;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(accept_language_.size());
  for (int i = 0, n = accept_language_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      accept_language_.Get(i));
  }

  // repeated string control_symbols = 30;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(control_symbols_.size());
  for (int i = 0, n = control_symbols_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      control_symbols_.Get(i));
  }

  // repeated string user_defined_symbols = 31;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(user_defined_symbols_.size());
  for (int i = 0, n = user_defined_symbols_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      user_defined_symbols_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string model_prefix = 2;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_model_prefix());
    }

    // optional string input_format = 7;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input_format());
    }

    // optional string required_chars = 36;
    if (cached_has_bits & 0x00000004u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_required_chars());
    }

    // optional string unk_surface = 44 [default = " \342\201\207 "];
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_unk_surface());
    }

    // optional string unk_piece = 45 [default = "<unk>"];
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_unk_piece());
    }

    // optional string bos_piece = 46 [default = "<s>"];
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_bos_piece());
    }

    // optional string eos_piece = 47 [default = "</s>"];
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_eos_piece());
    }

    // optional string pad_piece = 48 [default = "<pad>"];
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_pad_piece());
    }

  }
  if (cached_has_bits & 0x0000ff00u) {
    // optional string pretokenization_delimiter = 53 [default = ""];
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_pretokenization_delimiter());
    }

    // optional string seed_sentencepieces_file = 54 [default = ""];
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_seed_sentencepieces_file());
    }

    // optional int32 self_test_sample_size = 6 [default = 0];
    if (cached_has_bits & 0x00000400u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_self_test_sample_size());
    }

    // optional int32 mining_sentence_size = 12 [deprecated = true];
    if (cached_has_bits & 0x00000800u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_mining_sentence_size());
    }

    // optional uint64 input_sentence_size = 11 [default = 0];
    if (cached_has_bits & 0x00001000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_input_sentence_size());
    }

    // optional int32 training_sentence_size = 13 [deprecated = true];
    if (cached_has_bits & 0x00002000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_training_sentence_size());
    }

    // optional bool enable_differential_privacy = 50 [default = false];
    if (cached_has_bits & 0x00004000u) {
      total_size += 2 + 1;
    }

    // optional bool treat_whitespace_as_suffix = 24 [default = false];
    if (cached_has_bits & 0x00008000u) {
      total_size += 2 + 1;
    }

  }
  if (cached_has_bits & 0x00ff0000u) {
    // optional bool allow_whitespace_only_pieces = 26 [default = false];
    if (cached_has_bits & 0x00010000u) {
      total_size += 2 + 1;
    }

    // optional bool split_digits = 25 [default = false];
    if (cached_has_bits & 0x00020000u) {
      total_size += 2 + 1;
    }

    // optional bool byte_fallback = 35 [default = false];
    if (cached_has_bits & 0x00040000u) {
      total_size += 2 + 1;
    }

    // optional bool use_all_vocab = 34 [default = false];
    if (cached_has_bits & 0x00080000u) {
      total_size += 2 + 1;
    }

    // optional bool train_extremely_large_corpus = 49 [default = false];
    if (cached_has_bits & 0x00100000u) {
      total_size += 2 + 1;
    }

    // optional int32 unk_id = 40 [default = 0];
    if (cached_has_bits & 0x00200000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_unk_id());
    }

    // optional float differential_privacy_noise_level = 51 [default = 0];
    if (cached_has_bits & 0x00400000u) {
      total_size += 2 + 4;
    }

    // optional uint64 differential_privacy_clipping_threshold = 52 [default = 0];
    if (cached_has_bits & 0x00800000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_differential_privacy_clipping_threshold());
    }

  }
  if (cached_has_bits & 0xff000000u) {
    // optional .sentencepiece.TrainerSpec.ModelType model_type = 3 [default = UNIGRAM];
    if (cached_has_bits & 0x01000000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_model_type());
    }

    // optional int32 vocab_size = 4 [default = 8000];
    if (cached_has_bits & 0x02000000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_vocab_size());
    }

    // optional float character_coverage = 10 [default = 0.9995];
    if (cached_has_bits & 0x04000000u) {
      total_size += 1 + 4;
    }

    // optional int32 seed_sentencepiece_size = 14 [default = 1000000];
    if (cached_has_bits & 0x08000000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_seed_sentencepiece_size());
    }

    // optional float shrinking_factor = 15 [default = 0.75];
    if (cached_has_bits & 0x10000000u) {
      total_size += 1 + 4;
    }

    // optional int32 num_threads = 16 [default = 16];
    if (cached_has_bits & 0x20000000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_num_threads());
    }

    // optional int32 num_sub_iterations = 17 [default = 2];
    if (cached_has_bits & 0x40000000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_num_sub_iterations());
    }

    // optional int32 max_sentence_length = 18 [default = 4192];
    if (cached_has_bits & 0x80000000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_max_sentence_length());
    }

  }
  cached_has_bits = _has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    // optional int32 max_sentencepiece_length = 20 [default = 16];
    if (cached_has_bits & 0x00000001u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_max_sentencepiece_length());
    }

    // optional bool shuffle_input_sentence = 19 [default = true];
    if (cached_has_bits & 0x00000002u) {
      total_size += 2 + 1;
    }

    // optional bool split_by_unicode_script = 21 [default = true];
    if (cached_has_bits & 0x00000004u) {
      total_size += 2 + 1;
    }

    // optional bool split_by_number = 23 [default = true];
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 + 1;
    }

    // optional bool split_by_whitespace = 22 [default = true];
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 + 1;
    }

    // optional bool vocabulary_output_piece_score = 32 [default = true];
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 + 1;
    }

    // optional bool hard_vocab_limit = 33 [default = true];
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 + 1;
    }

    // optional int32 bos_id = 41 [default = 1];
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_bos_id());
    }

  }
  if (cached_has_bits & 0x00000300u) {
    // optional int32 eos_id = 42 [default = 2];
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_eos_id());
    }

    // optional int32 pad_id = 43 [default = -1];
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_pad_id());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}